

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O3

void crypto::iterated_hash<crypto::sha256_transform>::prepare_state
               (char *data,size_t count,hash_word *state)

{
  long lVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  hash_word aligned_buffer [16];
  undefined4 local_68;
  char acStack_64 [68];
  
  sha256_transform::init((EVP_PKEY_CTX *)state);
  lVar28 = count << 6;
  do {
    lVar27 = 0;
    do {
      auVar29 = *(undefined1 (*) [16])(data + lVar27 * 4);
      auVar31[1] = 0;
      auVar31[0] = auVar29[8];
      auVar31[2] = auVar29[9];
      auVar31[3] = 0;
      auVar31[4] = auVar29[10];
      auVar31[5] = 0;
      auVar31[6] = auVar29[0xb];
      auVar31[7] = 0;
      auVar31[8] = auVar29[0xc];
      auVar31[9] = 0;
      auVar31[10] = auVar29[0xd];
      auVar31[0xb] = 0;
      auVar31[0xc] = auVar29[0xe];
      auVar31[0xd] = 0;
      auVar31[0xe] = auVar29[0xf];
      auVar31[0xf] = 0;
      auVar30 = pshuflw(auVar31,auVar31,0x1b);
      auVar31 = pshufhw(auVar30,auVar30,0x1b);
      auVar18[0xd] = 0;
      auVar18._0_13_ = auVar29._0_13_;
      auVar18[0xe] = auVar29[7];
      auVar19[0xc] = auVar29[6];
      auVar19._0_12_ = auVar29._0_12_;
      auVar19._13_2_ = auVar18._13_2_;
      auVar20[0xb] = 0;
      auVar20._0_11_ = auVar29._0_11_;
      auVar20._12_3_ = auVar19._12_3_;
      auVar21[10] = auVar29[5];
      auVar21._0_10_ = auVar29._0_10_;
      auVar21._11_4_ = auVar20._11_4_;
      auVar22[9] = 0;
      auVar22._0_9_ = auVar29._0_9_;
      auVar22._10_5_ = auVar21._10_5_;
      auVar23[8] = auVar29[4];
      auVar23._0_8_ = auVar29._0_8_;
      auVar23._9_6_ = auVar22._9_6_;
      auVar24._7_8_ = 0;
      auVar24._0_7_ = auVar23._8_7_;
      auVar25._1_8_ = SUB158(auVar24 << 0x40,7);
      auVar25[0] = auVar29[3];
      auVar25._9_6_ = 0;
      auVar26._1_10_ = SUB1510(auVar25 << 0x30,5);
      auVar26[0] = auVar29[2];
      auVar26._11_4_ = 0;
      auVar30._3_12_ = SUB1512(auVar26 << 0x20,3);
      auVar30[2] = auVar29[1];
      auVar30[0] = auVar29[0];
      auVar30[1] = 0;
      auVar30[0xf] = 0;
      auVar29 = pshuflw(auVar30,auVar30,0x1b);
      auVar29 = pshufhw(auVar29,auVar29,0x1b);
      sVar2 = auVar29._0_2_;
      sVar3 = auVar29._2_2_;
      sVar4 = auVar29._4_2_;
      sVar5 = auVar29._6_2_;
      sVar6 = auVar29._8_2_;
      sVar7 = auVar29._10_2_;
      sVar8 = auVar29._12_2_;
      sVar9 = auVar29._14_2_;
      sVar10 = auVar31._0_2_;
      sVar11 = auVar31._2_2_;
      sVar12 = auVar31._4_2_;
      sVar13 = auVar31._6_2_;
      sVar14 = auVar31._8_2_;
      sVar15 = auVar31._10_2_;
      sVar16 = auVar31._12_2_;
      sVar17 = auVar31._14_2_;
      lVar1 = lVar27 * 4;
      *(char *)(&local_68 + lVar27) = (0 < sVar2) * (sVar2 < 0x100) * auVar29[0] - (0xff < sVar2);
      *(char *)((long)&local_68 + lVar1 + 1) =
           (0 < sVar3) * (sVar3 < 0x100) * auVar29[2] - (0xff < sVar3);
      *(char *)((long)&local_68 + lVar1 + 2) =
           (0 < sVar4) * (sVar4 < 0x100) * auVar29[4] - (0xff < sVar4);
      *(char *)((long)&local_68 + lVar1 + 3) =
           (0 < sVar5) * (sVar5 < 0x100) * auVar29[6] - (0xff < sVar5);
      acStack_64[lVar1] = (0 < sVar6) * (sVar6 < 0x100) * auVar29[8] - (0xff < sVar6);
      acStack_64[lVar1 + 1] = (0 < sVar7) * (sVar7 < 0x100) * auVar29[10] - (0xff < sVar7);
      acStack_64[lVar1 + 2] = (0 < sVar8) * (sVar8 < 0x100) * auVar29[0xc] - (0xff < sVar8);
      acStack_64[lVar1 + 3] = (0 < sVar9) * (sVar9 < 0x100) * auVar29[0xe] - (0xff < sVar9);
      acStack_64[lVar1 + 4] = (0 < sVar10) * (sVar10 < 0x100) * auVar31[0] - (0xff < sVar10);
      acStack_64[lVar1 + 5] = (0 < sVar11) * (sVar11 < 0x100) * auVar31[2] - (0xff < sVar11);
      acStack_64[lVar1 + 6] = (0 < sVar12) * (sVar12 < 0x100) * auVar31[4] - (0xff < sVar12);
      acStack_64[lVar1 + 7] = (0 < sVar13) * (sVar13 < 0x100) * auVar31[6] - (0xff < sVar13);
      acStack_64[lVar1 + 8] = (0 < sVar14) * (sVar14 < 0x100) * auVar31[8] - (0xff < sVar14);
      acStack_64[lVar1 + 9] = (0 < sVar15) * (sVar15 < 0x100) * auVar31[10] - (0xff < sVar15);
      acStack_64[lVar1 + 10] = (0 < sVar16) * (sVar16 < 0x100) * auVar31[0xc] - (0xff < sVar16);
      acStack_64[lVar1 + 0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar31[0xe] - (0xff < sVar17);
      lVar27 = lVar27 + 4;
    } while (lVar27 != 0x10);
    sha256_transform::transform(state,&local_68);
    data = data + 0x40;
    lVar28 = lVar28 + -0x40;
  } while (lVar28 != 0);
  return;
}

Assistant:

static void prepare_state(const char * data, size_t count, state_t state) {
		transform::init(state);
		hash(state, data, count * block_size);
	}